

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_driver.c
# Opt level: O0

int IFN_End_Of_Field(FORM *form)

{
  FIELD *pFVar1;
  char *local_20;
  char *pos;
  FIELD *field;
  FORM *form_local;
  
  pFVar1 = form->current;
  Synchronize_Buffer(form);
  local_20 = After_End_Of_Data(pFVar1->buf,pFVar1->drows * pFVar1->dcols);
  if (local_20 == pFVar1->buf + pFVar1->drows * pFVar1->dcols) {
    local_20 = local_20 + -1;
  }
  Adjust_Cursor_Position(form,local_20);
  return 0;
}

Assistant:

static int IFN_End_Of_Field(FORM * form)
{
  FIELD *field = form->current;
  char *pos;

  Synchronize_Buffer(form);
  pos = After_End_Of_Data(field->buf,Buffer_Length(field));
  if (pos==(field->buf + Buffer_Length(field)))
    pos--;
  Adjust_Cursor_Position(form,pos);
  return(E_OK);
}